

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void Catch::formatReconstructedExpression(ostream *os,string *lhs,StringRef *op,string *rhs)

{
  StringRef *str;
  long lVar1;
  ostream *poVar2;
  ostream *in_RCX;
  string *in_RSI;
  ostream *in_RDI;
  
  str = (StringRef *)std::__cxx11::string::size();
  lVar1 = std::__cxx11::string::size();
  if ((((ulong)((long)&str->m_start + lVar1) < 0x28) &&
      (lVar1 = std::__cxx11::string::find((char)in_RSI,10), lVar1 == -1)) &&
     (lVar1 = std::__cxx11::string::find((char)in_RCX,10), lVar1 == -1)) {
    poVar2 = std::operator<<(in_RDI,in_RSI);
    std::operator<<(poVar2," ");
    poVar2 = operator<<(in_RCX,str);
    poVar2 = std::operator<<(poVar2," ");
    std::operator<<(poVar2,(string *)in_RCX);
    return;
  }
  poVar2 = std::operator<<(in_RDI,in_RSI);
  std::operator<<(poVar2,"\n");
  poVar2 = operator<<(in_RCX,str);
  poVar2 = std::operator<<(poVar2,"\n");
  std::operator<<(poVar2,(string *)in_RCX);
  return;
}

Assistant:

void formatReconstructedExpression( std::ostream &os, std::string const& lhs, StringRef op, std::string const& rhs ) {
        if( lhs.size() + rhs.size() < 40 &&
                lhs.find('\n') == std::string::npos &&
                rhs.find('\n') == std::string::npos )
            os << lhs << " " << op << " " << rhs;
        else
            os << lhs << "\n" << op << "\n" << rhs;
    }